

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::encodeISETritBlock
               (BitAssignAccessStream *dst,int numBits,bool fromExplicitInputBlock,Block *blockInput
               ,deUint32 *nonBlockInput,int numValues)

{
  deUint32 dVar1;
  deUint32 local_78;
  deUint32 local_74;
  int local_6c;
  deUint32 T;
  int i;
  deUint32 bitParts [5];
  uint local_48 [2];
  deUint32 tritParts [5];
  int numValues_local;
  deUint32 *nonBlockInput_local;
  Block *blockInput_local;
  bool fromExplicitInputBlock_local;
  int numBits_local;
  BitAssignAccessStream *dst_local;
  
  for (local_6c = 0; local_6c < 5; local_6c = local_6c + 1) {
    if (local_6c < numValues) {
      if (fromExplicitInputBlock) {
        (&T)[local_6c] = blockInput->bitValues[local_6c];
        local_48[local_6c] = 0xffffffff;
      }
      else {
        if (numBits < 1) {
          local_74 = 0;
        }
        else {
          local_74 = getBits(nonBlockInput[local_6c],0,numBits + -1);
        }
        (&T)[local_6c] = local_74;
        local_48[local_6c] = nonBlockInput[local_6c] >> ((byte)numBits & 0x1f);
      }
    }
    else {
      (&T)[local_6c] = 0;
      local_48[local_6c] = 0;
    }
  }
  if (fromExplicitInputBlock) {
    local_78 = blockInput->tOrQValue;
  }
  else {
    local_78 = encodeISETritBlock::tritBlockTValue[local_48[0]][local_48[1]][tritParts[0]]
               [tritParts[1]][tritParts[2]];
  }
  BitAssignAccessStream::setNext(dst,numBits,T);
  dVar1 = getBits(local_78,0,1);
  BitAssignAccessStream::setNext(dst,2,dVar1);
  BitAssignAccessStream::setNext(dst,numBits,i);
  dVar1 = getBits(local_78,2,3);
  BitAssignAccessStream::setNext(dst,2,dVar1);
  BitAssignAccessStream::setNext(dst,numBits,bitParts[0]);
  dVar1 = getBit(local_78,4);
  BitAssignAccessStream::setNext(dst,1,dVar1);
  BitAssignAccessStream::setNext(dst,numBits,bitParts[1]);
  dVar1 = getBits(local_78,5,6);
  BitAssignAccessStream::setNext(dst,2,dVar1);
  BitAssignAccessStream::setNext(dst,numBits,bitParts[2]);
  dVar1 = getBit(local_78,7);
  BitAssignAccessStream::setNext(dst,1,dVar1);
  return;
}

Assistant:

static void encodeISETritBlock (BitAssignAccessStream& dst, int numBits, bool fromExplicitInputBlock, const ISEInput::Block& blockInput, const deUint32* nonBlockInput, int numValues)
{
	// tritBlockTValue[t0][t1][t2][t3][t4] is a value of T (not necessarily the only one) that will yield the given trits when decoded.
	static const deUint32 tritBlockTValue[3][3][3][3][3] =
	{
		{
			{{{0, 128, 96}, {32, 160, 224}, {64, 192, 28}}, {{16, 144, 112}, {48, 176, 240}, {80, 208, 156}}, {{3, 131, 99}, {35, 163, 227}, {67, 195, 31}}},
			{{{4, 132, 100}, {36, 164, 228}, {68, 196, 60}}, {{20, 148, 116}, {52, 180, 244}, {84, 212, 188}}, {{19, 147, 115}, {51, 179, 243}, {83, 211, 159}}},
			{{{8, 136, 104}, {40, 168, 232}, {72, 200, 92}}, {{24, 152, 120}, {56, 184, 248}, {88, 216, 220}}, {{12, 140, 108}, {44, 172, 236}, {76, 204, 124}}}
		},
		{
			{{{1, 129, 97}, {33, 161, 225}, {65, 193, 29}}, {{17, 145, 113}, {49, 177, 241}, {81, 209, 157}}, {{7, 135, 103}, {39, 167, 231}, {71, 199, 63}}},
			{{{5, 133, 101}, {37, 165, 229}, {69, 197, 61}}, {{21, 149, 117}, {53, 181, 245}, {85, 213, 189}}, {{23, 151, 119}, {55, 183, 247}, {87, 215, 191}}},
			{{{9, 137, 105}, {41, 169, 233}, {73, 201, 93}}, {{25, 153, 121}, {57, 185, 249}, {89, 217, 221}}, {{13, 141, 109}, {45, 173, 237}, {77, 205, 125}}}
		},
		{
			{{{2, 130, 98}, {34, 162, 226}, {66, 194, 30}}, {{18, 146, 114}, {50, 178, 242}, {82, 210, 158}}, {{11, 139, 107}, {43, 171, 235}, {75, 203, 95}}},
			{{{6, 134, 102}, {38, 166, 230}, {70, 198, 62}}, {{22, 150, 118}, {54, 182, 246}, {86, 214, 190}}, {{27, 155, 123}, {59, 187, 251}, {91, 219, 223}}},
			{{{10, 138, 106}, {42, 170, 234}, {74, 202, 94}}, {{26, 154, 122}, {58, 186, 250}, {90, 218, 222}}, {{14, 142, 110}, {46, 174, 238}, {78, 206, 126}}}
		}
	};

	DE_ASSERT(de::inRange(numValues, 1, 5));

	deUint32 tritParts[5];
	deUint32 bitParts[5];

	for (int i = 0; i < 5; i++)
	{
		if (i < numValues)
		{
			if (fromExplicitInputBlock)
			{
				bitParts[i]		= blockInput.bitValues[i];
				tritParts[i]	= -1; // \note Won't be used, but silences warning.
			}
			else
			{
				// \todo [2016-01-20 pyry] numBits = 0 doesn't make sense
				bitParts[i]		= numBits > 0 ? getBits(nonBlockInput[i], 0, numBits-1) : 0;
				tritParts[i]	= nonBlockInput[i] >> numBits;
			}
		}
		else
		{
			bitParts[i]		= 0;
			tritParts[i]	= 0;
		}
	}

	const deUint32 T = fromExplicitInputBlock ? blockInput.tOrQValue : tritBlockTValue[tritParts[0]]
																					  [tritParts[1]]
																					  [tritParts[2]]
																					  [tritParts[3]]
																					  [tritParts[4]];

	dst.setNext(numBits,	bitParts[0]);
	dst.setNext(2,			getBits(T, 0, 1));
	dst.setNext(numBits,	bitParts[1]);
	dst.setNext(2,			getBits(T, 2, 3));
	dst.setNext(numBits,	bitParts[2]);
	dst.setNext(1,			getBit(T, 4));
	dst.setNext(numBits,	bitParts[3]);
	dst.setNext(2,			getBits(T, 5, 6));
	dst.setNext(numBits,	bitParts[4]);
	dst.setNext(1,			getBit(T, 7));
}